

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall higan::Socket::Socket(Socket *this,InetAddress *address)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = socket(2,0x80801,0);
  this->fd_ = iVar2;
  (this->address_).ip_._M_dataplus._M_p = (pointer)&(this->address_).ip_.field_2;
  pcVar1 = (address->ip_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->address_,pcVar1,pcVar1 + (address->ip_)._M_string_length);
  (this->address_).port_ = address->port_;
  return;
}

Assistant:

Socket::Socket(const InetAddress& address):
		fd_(socket(PF_INET, SOCK_STREAM | SOCK_CLOEXEC | SOCK_NONBLOCK, 0)),
		address_(address)
{

}